

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_simple.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  LIBSSH2_SESSION *session_00;
  int rc;
  LIBSSH2_SESSION *session;
  char **argv_local;
  int argc_local;
  
  uVar1 = libssh2_init(1);
  if (uVar1 == 0) {
    session_00 = libssh2_session_init_ex
                           ((_func_void_ptr_size_t_void_ptr_ptr *)0x0,
                            (_func_void_void_ptr_void_ptr_ptr *)0x0,
                            (_func_void_ptr_void_ptr_size_t_void_ptr_ptr *)0x0,(void *)0x0);
    if (session_00 == (LIBSSH2_SESSION *)0x0) {
      fprintf(_stderr,"libssh2_session_init() failed\n");
      argv_local._4_4_ = 1;
    }
    else {
      test_libssh2_base64_decode(session_00);
      libssh2_session_free(session_00);
      libssh2_exit();
      argv_local._4_4_ = 0;
    }
  }
  else {
    fprintf(_stderr,"libssh2_init() failed: %d\n",(ulong)uVar1);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    LIBSSH2_SESSION *session;
    int rc;
    (void)argv;
    (void)argc;

    rc = libssh2_init(LIBSSH2_INIT_NO_CRYPTO);
    if(rc) {
        fprintf(stderr, "libssh2_init() failed: %d\n", rc);
        return 1;
    }

    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "libssh2_session_init() failed\n");
        return 1;
    }

    test_libssh2_base64_decode(session);

    libssh2_session_free(session);

    libssh2_exit();

    return 0;
}